

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV newP11Object(OSObject *object,P11Object **p11object)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  CK_KEY_TYPE keyType;
  CK_CERTIFICATE_TYPE certType;
  CK_RV CVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  keyType = 0;
  iVar1 = (*object->_vptr_OSObject[5])(object,0,0x80000000);
  iVar2 = (*object->_vptr_OSObject[2])(object,0x100);
  if ((char)iVar2 != '\0') {
    iVar2 = (*object->_vptr_OSObject[5])(object,0x100,0);
    keyType = CONCAT44(extraout_var_00,iVar2);
  }
  iVar2 = (*object->_vptr_OSObject[2])(object,0x80);
  if ((char)iVar2 == '\0') {
    certType = 0;
  }
  else {
    iVar2 = (*object->_vptr_OSObject[5])(object,0x80,0);
    certType = CONCAT44(extraout_var_01,iVar2);
  }
  CVar3 = newP11Object(CONCAT44(extraout_var,iVar1),keyType,certType,p11object);
  if (CVar3 == 0) {
    iVar1 = (*(*p11object)->_vptr_P11Object[2])(*p11object,object);
    CVar3 = (ulong)(byte)((byte)iVar1 ^ 1) * 5;
  }
  return CVar3;
}

Assistant:

static CK_RV newP11Object(OSObject *object, P11Object **p11object)
{
	CK_OBJECT_CLASS objClass = object->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED);
	CK_KEY_TYPE keyType = CKK_RSA;
	CK_CERTIFICATE_TYPE certType = CKC_X_509;
	if (object->attributeExists(CKA_KEY_TYPE))
		keyType = object->getUnsignedLongValue(CKA_KEY_TYPE, CKK_RSA);
	if (object->attributeExists(CKA_CERTIFICATE_TYPE))
		certType = object->getUnsignedLongValue(CKA_CERTIFICATE_TYPE, CKC_X_509);
	CK_RV rv = newP11Object(objClass,keyType,certType,p11object);
	if (rv != CKR_OK)
		return rv;
	if (!(*p11object)->init(object))
		return CKR_GENERAL_ERROR; // something went wrong that shouldn't have.
	return CKR_OK;
}